

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O3

bool __thiscall
ON_3dmUnitsAndTolerances::Read(ON_3dmUnitsAndTolerances *this,ON_BinaryArchive *file)

{
  undefined3 uVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  undefined8 uVar7;
  bool bVar8;
  LengthUnitSystem us;
  bool bVar9;
  OBSOLETE_DistanceDisplayMode OVar10;
  wchar_t *custom_unit_name_00;
  int version;
  uint dm;
  ON_wString custom_unit_name;
  int i;
  double meters_per_unit;
  ON__INT32 local_40;
  ON__UINT32 local_3c;
  ON_wString local_38;
  uint local_2c;
  double local_28;
  
  dVar3 = Millimeters.m_unit_system.m_meters_per_custom_unit;
  uVar1 = Millimeters.m_unit_system._1_3_;
  uVar2 = Millimeters.m_unit_system.m_reserved;
  (this->m_unit_system).m_unit_system = Millimeters.m_unit_system.m_unit_system;
  *(undefined3 *)&(this->m_unit_system).field_0x1 = uVar1;
  (this->m_unit_system).m_reserved = uVar2;
  (this->m_unit_system).m_meters_per_custom_unit = dVar3;
  ON_wString::operator=
            (&(this->m_unit_system).m_custom_unit_name,&Millimeters.m_unit_system.m_custom_unit_name
            );
  uVar5 = Millimeters._48_8_;
  dVar4 = Millimeters.m_relative_tolerance;
  dVar3 = Millimeters.m_angle_tolerance;
  this->m_absolute_tolerance = Millimeters.m_absolute_tolerance;
  this->m_angle_tolerance = dVar3;
  this->m_relative_tolerance = dVar4;
  uVar7 = Millimeters._48_8_;
  Millimeters.m_distance_display_mode = (OBSOLETE_DistanceDisplayMode)uVar5;
  Millimeters._49_3_ = SUB83(uVar5,1);
  uVar1 = Millimeters._49_3_;
  Millimeters.m_distance_display_precision = SUB84(uVar5,4);
  iVar6 = Millimeters.m_distance_display_precision;
  this->m_distance_display_mode = Millimeters.m_distance_display_mode;
  Millimeters._48_8_ = uVar7;
  *(undefined3 *)&this->field_0x31 = uVar1;
  this->m_distance_display_precision = iVar6;
  local_40 = 0;
  bVar8 = ON_BinaryArchive::ReadInt(file,&local_40);
  if (!bVar8) {
    return bVar8;
  }
  if (local_40 - 100U < 100) {
    local_28 = 1.0;
    ON_wString::ON_wString(&local_38);
    local_2c = 0xffffffff;
    bVar8 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_2c);
    us = None;
    bVar9 = false;
    if (bVar8) {
      us = ON::LengthUnitSystemFromUnsigned(local_2c);
      bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_absolute_tolerance);
      if ((bVar8) && (bVar8 = ON_BinaryArchive::ReadDouble(file,&this->m_angle_tolerance), bVar8)) {
        bVar9 = ON_BinaryArchive::ReadDouble(file,&this->m_relative_tolerance);
      }
      else {
        bVar9 = false;
      }
    }
    if (100 < local_40) {
      local_3c = 0;
      if ((bVar9 == false) || (bVar8 = ON_BinaryArchive::ReadInt(file,&local_3c), !bVar8)) {
        bVar9 = false;
      }
      else {
        OVar10 = ON::DistanceDisplayModeFromUnsigned(local_3c);
        this->m_distance_display_mode = OVar10;
        bVar9 = ON_BinaryArchive::ReadInt(file,&this->m_distance_display_precision);
      }
      if (0x14 < (uint)this->m_distance_display_precision) {
        this->m_distance_display_precision = 3;
      }
      if ((0x65 < local_40 & bVar9) == 1) {
        bVar8 = ON_BinaryArchive::ReadDouble(file,&local_28);
        if (bVar8) {
          bVar9 = ON_BinaryArchive::ReadString(file,&local_38);
        }
        else {
          bVar9 = false;
        }
      }
      else {
        bVar9 = (bool)(bVar9 & local_40 < 0x66);
      }
    }
    if (us == CustomUnits) {
      custom_unit_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_38);
      ON_UnitSystem::SetCustomUnitSystem(&this->m_unit_system,custom_unit_name_00,local_28);
    }
    else {
      ON_UnitSystem::SetUnitSystem(&this->m_unit_system,us);
    }
    ON_wString::~ON_wString(&local_38);
    return bVar9;
  }
  return bVar8;
}

Assistant:

bool ON_3dmUnitsAndTolerances::Read( ON_BinaryArchive& file )
{
  *this = ON_3dmUnitsAndTolerances::Millimeters;
  int version = 0;
  bool rc = file.ReadInt( &version );
  if ( rc && version >= 100 && version < 200 )
  {
    ON::LengthUnitSystem us = ON::LengthUnitSystem::None;
    double meters_per_unit = 1.0;
    ON_wString custom_unit_name;

    int i = ON_UNSET_UINT_INDEX;
    rc = file.ReadInt( &i );
    if ( rc )
      us = ON::LengthUnitSystemFromUnsigned(i);
    if ( rc ) rc = file.ReadDouble( &m_absolute_tolerance );
    if ( rc ) rc = file.ReadDouble( &m_angle_tolerance );
    if ( rc ) rc = file.ReadDouble( &m_relative_tolerance );
    if ( version >= 101 ) 
    {
      unsigned int dm = static_cast<unsigned int>(ON::OBSOLETE_DistanceDisplayMode::Decimal);
      if ( rc ) rc = file.ReadInt( &dm );
      if ( rc ) m_distance_display_mode = ON::DistanceDisplayModeFromUnsigned(dm);
      if ( rc ) rc = file.ReadInt( &m_distance_display_precision );
      if ( m_distance_display_precision < 0 || m_distance_display_precision > 20 )
        m_distance_display_precision = 3; // some beta files had bogus values stored in file
      if ( version >= 102 ) 
      {
        if ( rc ) rc = file.ReadDouble( &meters_per_unit );
        if ( rc ) rc = file.ReadString( custom_unit_name );
      }
    }
    if ( ON::LengthUnitSystem::CustomUnits == us )
      m_unit_system.SetCustomUnitSystem(custom_unit_name,meters_per_unit);
    else
      m_unit_system.SetUnitSystem(us);
  }
  return rc;
}